

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O0

void __thiscall
cppjieba::KeywordExtractor::Extract
          (KeywordExtractor *this,string *sentence,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *keywords,size_t topN)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *ppVar1;
  reference __x;
  value_type *in_RDX;
  size_t i;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  topWords;
  size_t in_stack_00000238;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  *in_stack_00000240;
  string *in_stack_00000248;
  KeywordExtractor *in_stack_00000250;
  value_type *__x_00;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_50;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  local_38;
  value_type *local_18;
  
  local_18 = in_RDX;
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  vector((vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
          *)0x1504c3);
  Extract(in_stack_00000250,in_stack_00000248,in_stack_00000240,in_stack_00000238);
  local_50 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)0x0;
  while( true ) {
    this_01 = local_50;
    ppVar1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
              *)std::
                vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                ::size(&local_38);
    if (ppVar1 <= this_01) break;
    this_00 = &local_38;
    __x_00 = local_18;
    __x = std::
          vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
          ::operator[](this_00,(size_type)local_50);
    std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
    ::operator[](this_00,(size_type)local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_double_&,_true>
              (this_01,&__x->word,(double *)this_00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)this_00,__x_00);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *)0x150578);
    local_50 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)&local_50->field_0x1;
  }
  std::vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
  ~vector((vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
           *)this_01);
  return;
}

Assistant:

void Extract(const string& sentence, vector<pair<string, double> >& keywords, size_t topN) const {
    vector<Word> topWords;
    Extract(sentence, topWords, topN);
    for (size_t i = 0; i < topWords.size(); i++) {
      keywords.push_back(pair<string, double>(topWords[i].word, topWords[i].weight));
    }
  }